

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

MinBroadcastableLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_minbroadcastable(NeuralNetworkLayer *this)

{
  MinBroadcastableLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0x366) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x366;
    this_00 = (MinBroadcastableLayerParams *)operator_new(0x18);
    MinBroadcastableLayerParams::MinBroadcastableLayerParams(this_00);
    (this->layer_).minbroadcastable_ = this_00;
  }
  return (MinBroadcastableLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::MinBroadcastableLayerParams* NeuralNetworkLayer::mutable_minbroadcastable() {
  if (!has_minbroadcastable()) {
    clear_layer();
    set_has_minbroadcastable();
    layer_.minbroadcastable_ = new ::CoreML::Specification::MinBroadcastableLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.minBroadcastable)
  return layer_.minbroadcastable_;
}